

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::LoadUSDAFromMemory
               (uint8_t *addr,size_t length,string *base_dir,Stage *stage,string *warn,string *err,
               USDLoadOptions *options)

{
  bool bVar1;
  ssize_t sVar2;
  Stage *pSVar3;
  USDAReader reader;
  USDAReaderConfig local_94;
  string local_90;
  string local_70;
  StreamReader sr;
  
  if ((addr == (uint8_t *)0x0) || (stage == (Stage *)0x0)) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::assign((char *)err);
    }
    return false;
  }
  sr.swap_endian_ = false;
  sr.idx_ = 0;
  pSVar3 = stage;
  sr.binary_ = addr;
  sr.length_ = length;
  usda::USDAReader::USDAReader(&reader,&sr);
  local_94.allow_unknown_prims = true;
  local_94.allow_unknown_shader = true;
  local_94.strict_allowedToken_check = options->strict_allowedToken_check;
  local_94.allow_unknown_apiSchema = (bool)(options->strict_apiSchema_check ^ 1);
  usda::USDAReader::set_reader_config(&reader,&local_94);
  usda::USDAReader::set_base_dir(&reader,(string *)base_dir);
  sVar2 = usda::USDAReader::read(&reader,1,(void *)0x0,(size_t)pSVar3);
  if ((char)sVar2 == '\0') {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
      usda::USDAReader::get_error_abi_cxx11_(&local_90,&reader);
      ::std::__cxx11::string::append((string *)err);
LAB_00119c77:
      ::std::__cxx11::string::_M_dispose();
    }
  }
  else {
    bVar1 = usda::USDAReader::reconstruct_stage(&reader);
    if (bVar1) {
      pSVar3 = usda::USDAReader::get_stage(&reader);
      Stage::operator=(stage,pSVar3);
      bVar1 = true;
      if (warn != (string *)0x0) {
        usda::USDAReader::get_warning_abi_cxx11_(&local_90,&reader);
        ::std::__cxx11::string::append((string *)warn);
        ::std::__cxx11::string::_M_dispose();
      }
      goto LAB_00119c81;
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
      usda::USDAReader::get_error_abi_cxx11_(&local_70,&reader);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_70,"\n");
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      goto LAB_00119c77;
    }
  }
  bVar1 = false;
LAB_00119c81:
  usda::USDAReader::~USDAReader(&reader);
  return bVar1;
}

Assistant:

bool LoadUSDAFromMemory(const uint8_t *addr, const size_t length,
                        const std::string &base_dir, Stage *stage,
                        std::string *warn, std::string *err,
                        const USDLoadOptions &options) {
  if (addr == nullptr) {
    if (err) {
      (*err) = "null pointer for `addr` argument.\n";
    }
    return false;
  }

  if (stage == nullptr) {
    if (err) {
      (*err) = "null pointer for `stage` argument.\n";
    }
    return false;
  }

  tinyusdz::StreamReader sr(addr, length, /* swap endian */ false);
  tinyusdz::usda::USDAReader reader(&sr);

  tinyusdz::usda::USDAReaderConfig config;
  config.strict_allowedToken_check = options.strict_allowedToken_check;
  config.allow_unknown_apiSchema = !options.strict_apiSchema_check;
  reader.set_reader_config(config);

  reader.SetBaseDir(base_dir);

  {
    bool ret = reader.Read();

    if (!ret) {
      if (err) {
        (*err) += "Failed to parse USDA\n";
        (*err) += reader.GetError();
      }

      return false;
    }
  }

  {
    bool ret = reader.ReconstructStage();
    if (!ret) {
      if (err) {
        (*err) += "Failed to reconstruct Stage from USDA:\n";
        (*err) += reader.GetError() + "\n";
      }
      return false;
    }
  }

  (*stage) = reader.GetStage();

  if (warn) {
    (*warn) += reader.GetWarning();
  }

  return true;
}